

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall ProblemTest_MaxLogicalCons_Test::TestBody(ProblemTest_MaxLogicalCons_Test *this)

{
  LogicalConstant LVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  AssertHelper local_3b0;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  iVar3 = 100;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    LVar1 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                      (&p.super_ExprFactory,true);
    mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
              (&p,(LogicalExpr)
                  LVar1.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_
              );
  }
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  local_3b0.data_._0_4_ =
       (undefined4)
       ((ulong)((long)p.logical_cons_.
                      super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)p.logical_cons_.
                     super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"100","p.num_logical_cons()",(int *)&gtest_ar_1,(int *)&local_3b0
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1d0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar_1.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar,"too many logical constraints",(allocator<char> *)&local_3b0);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      LVar1 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                        (&p.super_ExprFactory,true);
      mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                (&p,(LogicalExpr)
                    LVar1.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                    impl_);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_1,
               (char (*) [123])
               "Expected: p.AddCon(p.MakeLogicalConstant(true)) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_1.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x1d2,pcVar2);
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, MaxLogicalCons) {
  Problem p;
  for (int i = 0; i < MP_MAX_PROBLEM_ITEMS; ++i)
    p.AddCon(p.MakeLogicalConstant(true));
  EXPECT_EQ(MP_MAX_PROBLEM_ITEMS, p.num_logical_cons());
  EXPECT_ASSERT(p.AddCon(p.MakeLogicalConstant(true)),
                "too many logical constraints");
}